

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall
ImGui::DockBuilderRemoveNodeDockedWindows(ImGui *this,ImGuiID root_id,bool clear_settings_refs)

{
  ImChunkStream<ImGuiWindowSettings> *this_00;
  ImGuiDockContext *this_01;
  int iVar1;
  char *pcVar2;
  ImGuiContext *ctx;
  ImGuiContext *pIVar3;
  ImGuiID *pIVar4;
  ImGuiID *pIVar5;
  ulong uVar6;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ImGuiID IVar7;
  ImGuiWindowSettings *p;
  long lVar8;
  bool bVar9;
  byte local_34;
  
  pIVar3 = GImGui;
  uVar6 = (ulong)clear_settings_refs;
  IVar7 = (ImGuiID)this;
  if ((root_id != 0) && (pcVar2 = (GImGui->SettingsWindows).Buf.Data, pcVar2 != (char *)0x0)) {
    this_00 = &GImGui->SettingsWindows;
    p = (ImGuiWindowSettings *)(pcVar2 + 4);
    this_01 = &GImGui->DockContext;
    do {
      if (IVar7 == 0) {
        bVar9 = true;
      }
      else {
        bVar9 = p->DockId == IVar7;
      }
      if ((!bVar9) && (p->DockId != 0)) {
        pIVar4 = (ImGuiID *)ImGuiStorage::GetVoidPtr(&this_01->Nodes,p->DockId);
        if (pIVar4 != (ImGuiID *)0x0) {
          do {
            pIVar5 = pIVar4;
            pIVar4 = *(ImGuiID **)(pIVar5 + 6);
          } while (pIVar4 != (ImGuiID *)0x0);
          bVar9 = *pIVar5 == IVar7;
        }
      }
      if (bVar9) {
        p->DockId = 0;
      }
      p = ImChunkStream<ImGuiWindowSettings>::next_chunk(this_00,p);
      uVar6 = extraout_RDX;
    } while (p != (ImGuiWindowSettings *)0x0);
  }
  if (0 < (pIVar3->Windows).Size) {
    lVar8 = 0;
    local_34 = (byte)root_id;
    do {
      ctx = (ImGuiContext *)(pIVar3->Windows).Data[lVar8];
      if (IVar7 == 0) {
LAB_0016c23c:
        iVar1 = (ctx->IO).KeyMap[0xca];
        DockContextProcessUndockWindow(ctx,(ImGuiWindow *)(ulong)local_34,SUB81(uVar6,0));
        uVar6 = extraout_RDX_00;
        if ((local_34 == 0) && ((ctx->IO).KeyMap[0xca] != iVar1)) {
          __assert_fail("window->DockId == backup_dock_id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x40f4,"void ImGui::DockBuilderRemoveNodeDockedWindows(ImGuiID, bool)");
        }
      }
      else {
        pIVar4 = *(ImGuiID **)((ctx->IO).KeyMap + 0xc6);
        if (pIVar4 != (ImGuiID *)0x0) {
          do {
            pIVar5 = pIVar4;
            pIVar4 = *(ImGuiID **)(pIVar5 + 6);
          } while (pIVar4 != (ImGuiID *)0x0);
          if (*pIVar5 == IVar7) goto LAB_0016c23c;
        }
        pIVar4 = *(ImGuiID **)((ctx->IO).KeyMap + 200);
        if ((pIVar4 != (ImGuiID *)0x0) && (*pIVar4 == IVar7)) goto LAB_0016c23c;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pIVar3->Windows).Size);
  }
  return;
}

Assistant:

void ImGui::DockBuilderRemoveNodeDockedWindows(ImGuiID root_id, bool clear_settings_refs)
{
    // Clear references in settings
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    if (clear_settings_refs)
    {
        for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        {
            bool want_removal = (root_id == 0) || (settings->DockId == root_id);
            if (!want_removal && settings->DockId != 0)
                if (ImGuiDockNode* node = DockContextFindNodeByID(ctx, settings->DockId))
                    if (DockNodeGetRootNode(node)->ID == root_id)
                        want_removal = true;
            if (want_removal)
                settings->DockId = 0;
        }
    }

    // Clear references in windows
    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        bool want_removal = (root_id == 0) || (window->DockNode && DockNodeGetRootNode(window->DockNode)->ID == root_id) || (window->DockNodeAsHost && window->DockNodeAsHost->ID == root_id);
        if (want_removal)
        {
            const ImGuiID backup_dock_id = window->DockId;
            IM_UNUSED(backup_dock_id);
            DockContextProcessUndockWindow(ctx, window, clear_settings_refs);
            if (!clear_settings_refs)
                IM_ASSERT(window->DockId == backup_dock_id);
        }
    }
}